

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

Token * __thiscall Parser::compareOp(Token *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  string local_60;
  string local_40;
  
  Tokenizer::getToken(__return_storage_ptr__,this->tokenizer);
  bVar1 = Token::isComparisonOperator(__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Parser::compareOp","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Expected comparison operator, instead got","");
  die(this,&local_40,&local_60,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  Token::~Token(__return_storage_ptr__);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Token Parser::compareOp() {
    // comp_op:  < > == >= <= <> !=

    Token compOp = tokenizer.getToken();
    if(!compOp.isComparisonOperator())
        die("Parser::compareOp", "Expected comparison operator, instead got", compOp);
    return compOp;
}